

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  float *__s;
  float *pfVar2;
  GLuint GVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  float fVar8;
  GLuint groups [3];
  undefined1 *local_38;
  undefined4 local_30;
  
  __s = (float *)operator_new(0x1000);
  memset(__s,0,0x1000);
  buffers = &this->m_storage_buffer;
  GVar3 = this->m_storage_buffer;
  if (GVar3 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,buffers);
    GVar3 = *buffers;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x1000,__s,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_38 = &DAT_100000001;
    local_30 = 1;
    GVar3 = this->m_dispatch_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar3 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_38,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar5 = 0x1000;
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x1000,__s);
  lVar6 = 0;
  bVar7 = false;
  pfVar2 = __s;
  do {
    fVar8 = (float)(int)(uint)lVar6;
    auVar1._4_4_ = -(uint)(pfVar2[1] == fVar8);
    auVar1._0_4_ = -(uint)(*pfVar2 == fVar8);
    auVar1._8_4_ = -(uint)(pfVar2[2] == fVar8);
    auVar1._12_4_ = -(uint)(pfVar2[3] == fVar8);
    uVar4 = movmskps((int)uVar5,auVar1);
    uVar5 = (ulong)uVar4;
    if (uVar4 != 0xf) {
      anon_unknown_0::Output("Invalid data at index %d.\n");
      break;
    }
    bVar7 = 0xfe < (uint)lVar6;
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 4;
  } while (lVar6 != 0x100);
  operator_delete(__s,0x1000);
  return bVar7;
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(data[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				return false;
			}
		}
		return true;
	}